

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSliceStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  SliceStaticLayerParams *pSVar2;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Result r;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar1 = Result::good(&r);
  if (bVar1) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  pSVar2 = Specification::NeuralNetworkLayer::slicestatic(layer);
  if ((pSVar2->beginids_).current_size_ == 0) {
    std::operator+(&local_60,"Begin IDs are required parameters for \'",(layer->name_).ptr_);
    std::operator+(&err,&local_60,"\' layer.");
    std::__cxx11::string::~string((string *)&local_60);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else if ((pSVar2->endids_).current_size_ == 0) {
    std::operator+(&local_60,"End IDs are required parameters for \'",(layer->name_).ptr_);
    std::operator+(&err,&local_60,"\' layer.");
    std::__cxx11::string::~string((string *)&local_60);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else if ((pSVar2->strides_).current_size_ == 0) {
    std::operator+(&local_60,"Strides are required parameters for \'",(layer->name_).ptr_);
    std::operator+(&err,&local_60,"\' layer.");
    std::__cxx11::string::~string((string *)&local_60);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else if ((pSVar2->beginmasks_).current_size_ == 0) {
    std::operator+(&local_60,"Begin masks are required parameters for \'",(layer->name_).ptr_);
    std::operator+(&err,&local_60,"\' layer.");
    std::__cxx11::string::~string((string *)&local_60);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else {
    if ((pSVar2->endmasks_).current_size_ != 0) {
      Result::Result(__return_storage_ptr__,&r);
      goto LAB_0059ca64;
    }
    std::operator+(&local_60,"End masks are required parameters for \'",(layer->name_).ptr_);
    std::operator+(&err,&local_60,"\' layer.");
    std::__cxx11::string::~string((string *)&local_60);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  std::__cxx11::string::~string((string *)&err);
LAB_0059ca64:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSliceStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.slicestatic();
    // check for required parameters
    if (params.beginids_size() == 0) {
        const std::string err = "Begin IDs are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.endids_size() == 0) {
        const std::string err = "End IDs are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.strides_size() == 0) {
        const std::string err = "Strides are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.beginmasks_size() == 0) {
        const std::string err = "Begin masks are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.endmasks_size() == 0) {
        const std::string err = "End masks are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}